

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

Status __thiscall
leveldb::BlockConstructor::FinishImpl(BlockConstructor *this,Options *options,KVMap *data)

{
  bool bVar1;
  Block *pBVar2;
  undefined8 in_RCX;
  Slice local_128;
  undefined1 local_118 [8];
  BlockContents contents;
  string local_f0;
  Slice local_d0;
  Slice local_c0;
  reference local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kvp;
  const_iterator __end2;
  const_iterator __begin2;
  KVMap *__range2;
  BlockBuilder builder;
  KVMap *data_local;
  Options *options_local;
  BlockConstructor *this_local;
  
  pBVar2 = (Block *)options[1].comparator;
  builder.last_key_.field_2._8_8_ = in_RCX;
  if (pBVar2 != (Block *)0x0) {
    Block::~Block(pBVar2);
    operator_delete(pBVar2);
  }
  options[1].comparator = (Comparator *)0x0;
  BlockBuilder::BlockBuilder((BlockBuilder *)&__range2,(Options *)data);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)builder.last_key_.field_2._8_8_);
  kvp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)builder.last_key_.field_2._8_8_);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&kvp);
    if (!bVar1) break;
    local_b0 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
    Slice::Slice(&local_c0,&local_b0->first);
    Slice::Slice(&local_d0,&local_b0->second);
    BlockBuilder::Add((BlockBuilder *)&__range2,&local_c0,&local_d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  join_0x00000010_0x00000000_ = BlockBuilder::Finish((BlockBuilder *)&__range2);
  Slice::ToString_abi_cxx11_(&local_f0,(Slice *)&contents.cachable);
  std::__cxx11::string::operator=((string *)&options->block_restart_interval,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  BlockContents::BlockContents((BlockContents *)local_118);
  Slice::Slice(&local_128,(string *)&options->block_restart_interval);
  local_118 = (undefined1  [8])local_128.data_;
  contents.data.data_ = (char *)local_128.size_;
  contents.data.size_._0_1_ = 0;
  contents.data.size_._1_1_ = 0;
  pBVar2 = (Block *)operator_new(0x18);
  Block::Block(pBVar2,(BlockContents *)local_118);
  options[1].comparator = (Comparator *)pBVar2;
  Status::OK();
  BlockBuilder::~BlockBuilder((BlockBuilder *)&__range2);
  return (Status)(char *)this;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete block_;
    block_ = nullptr;
    BlockBuilder builder(&options);

    for (const auto& kvp : data) {
      builder.Add(kvp.first, kvp.second);
    }
    // Open the block
    data_ = builder.Finish().ToString();
    BlockContents contents;
    contents.data = data_;
    contents.cachable = false;
    contents.heap_allocated = false;
    block_ = new Block(contents);
    return Status::OK();
  }